

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::HttpInputStream::Message> * __thiscall
kj::_::ExceptionOr<kj::HttpInputStream::Message>::operator=
          (ExceptionOr<kj::HttpInputStream::Message> *this,
          ExceptionOr<kj::HttpInputStream::Message> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<kj::HttpInputStream::Message>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;